

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void crec_copy(jit_State *J,TRef trdst,TRef trsrc,TRef trlen,CType *ct)

{
  CTypeID1 CVar1;
  IRType IVar2;
  CTSize CVar3;
  CType *pCVar4;
  bool bVar5;
  IRType IVar6;
  TRef TVar7;
  TRef TVar8;
  uint uVar9;
  cTValue *tv;
  bool bVar10;
  IRType IVar11;
  ulong uVar12;
  int iVar13;
  CTState *cts;
  IRType *pIVar14;
  ushort uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  TRef *pTVar21;
  CType *pCVar22;
  IRType IVar23;
  CRecMemList ml [16];
  CTSize local_138;
  IRType local_134;
  TRef local_130 [64];
  
  if (-1 < (short)trlen) {
    IVar2 = (J->cur).ir[trlen & 0x7fff].field_1.op12;
    if (IVar2 == IRT_NIL) {
      return;
    }
    if (IVar2 < (IRT_GUARD|IRT_FALSE)) {
      IVar23 = IRT_NIL;
      if (ct == (CType *)0x0) {
        IVar6 = IRT_CDATA;
LAB_00136fed:
        uVar19 = 8;
        bVar10 = false;
LAB_00136ffb:
        uVar16 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        IVar11 = ((uVar16 ^ 0x1f) * 2 ^ 0x3e) + IRT_U8;
        if (IVar6 != IRT_CDATA) {
          IVar11 = IVar6;
        }
        uVar12 = 0;
        do {
          if (IVar23 + uVar19 <= IVar2) {
            uVar17 = uVar12;
            if ((uint)uVar12 < 0x11) {
              uVar17 = 0x10;
            }
            pIVar14 = &local_134 + uVar12 * 4;
            lVar18 = 0;
            do {
              if (uVar12 - uVar17 == lVar18) {
                uVar16 = 0;
                goto LAB_00137078;
              }
              pIVar14[-1] = IVar23;
              *pIVar14 = IVar11;
              lVar18 = lVar18 + -1;
              pIVar14 = pIVar14 + 4;
              IVar23 = IVar23 + uVar19;
            } while (uVar19 + IVar23 <= IVar2);
            uVar12 = (ulong)((uint)uVar12 - (int)lVar18);
          }
          uVar16 = (uint)uVar12;
          uVar19 = uVar19 >> 1;
          IVar11 = IVar11 - IRT_TRUE;
        } while (IVar23 < IVar2);
      }
      else {
        cts = (CTState *)(ulong)J[-1].bpropcache[9].mode;
        uVar16 = ct->info;
        if ((uVar16 & 0xf0000000) == 0x30000000) {
          IVar6 = crec_ct2irt(cts,cts->tab + (ushort)ct->info);
          if (IVar6 == IRT_CDATA) {
            uVar19 = 1;
            iVar13 = 3;
          }
          else {
            uVar19 = (uint)"\x04\x04\x04\b\x04\x04\x04\x04\x04\b\x04\x04\x04\x04\b\x01\x01\x02\x02\x04\x04\b\b\x04"
                           [IVar6];
            iVar13 = 0;
          }
          uVar16 = 0;
        }
        else if ((uVar16 >> 0x17 & 1) == 0) {
          iVar13 = 4;
          IVar6 = IRT_CDATA;
          if (ct->sib == 0) {
            uVar16 = 0;
            uVar19 = 1;
          }
          else {
            pCVar4 = cts->tab;
            uVar16 = 0;
            uVar15 = ct->sib;
            do {
              CVar1 = pCVar4[uVar15].sib;
              uVar19 = pCVar4[uVar15].info >> 0x1c;
              if (uVar19 == 0xb) {
LAB_00136f4e:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if (uVar19 == 9) {
                  pCVar22 = pCVar4 + uVar15;
                  if ((pCVar22->name).gcptr32 == 0) {
                    bVar10 = false;
                    bVar5 = false;
                  }
                  else {
                    uVar15 = (ushort)pCVar22->info;
                    uVar19 = pCVar4[uVar15].info;
                    IVar6 = crec_ct2irt(cts,pCVar4 + uVar15);
                    bVar5 = false;
                    bVar10 = true;
                    if ((IVar6 != IRT_CDATA) && (uVar16 < 0x10)) {
                      CVar3 = pCVar22->size;
                      (&local_138)[(ulong)uVar16 * 4] = CVar3;
                      (&local_134)[(ulong)uVar16 * 4] = IVar6;
                      uVar9 = uVar16 + 1;
                      bVar5 = true;
                      if ((uVar19 & 0xf4000000) == 0x34000000) {
                        if (uVar16 == 0xf) {
                          bVar5 = false;
                          uVar16 = 0x10;
                        }
                        else {
                          (&local_138)[(ulong)uVar9 * 4] = (pCVar4[uVar15].size >> 1) + CVar3;
                          (&local_134)[(ulong)uVar9 * 4] = IVar6;
                          bVar10 = false;
                          uVar16 = uVar16 + 2;
                        }
                      }
                      else {
                        bVar10 = false;
                        uVar16 = uVar9;
                      }
                    }
                  }
                  if (bVar5) goto LAB_00136f4e;
                }
              }
              IVar6 = IRT_CDATA;
              iVar13 = 4;
              uVar19 = 1;
              if (bVar10) {
                uVar16 = 0;
                break;
              }
              uVar15 = CVar1;
            } while (CVar1 != 0);
          }
        }
        else {
          uVar19 = 1 << ((byte)(uVar16 >> 0x10) & 0xf);
          uVar16 = 0;
          iVar13 = 3;
          IVar6 = IRT_CDATA;
        }
        bVar10 = true;
        if (iVar13 == 0) goto LAB_00136ffb;
        if (iVar13 != 4) {
          if (iVar13 != 3) goto LAB_001371e9;
          goto LAB_00136fed;
        }
      }
LAB_00137078:
      if (uVar16 != 0) {
        uVar20 = 1;
        uVar19 = 0;
        uVar9 = 0;
        uVar12 = 0;
        do {
          tv = lj_ir_k64_find(J,(ulong)(&local_138)[uVar12 * 4]);
          TVar7 = lj_ir_k64(J,IR_KINT64,tv);
          (J->fold).ins.field_0.ot = 0x2809;
          (J->fold).ins.field_0.op1 = (IRRef1)trsrc;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
          TVar8 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)(&local_134)[uVar12 * 4] | 0x4400;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = 0;
          TVar8 = lj_opt_fold(J);
          local_130[uVar12 * 4 + 1] = TVar8;
          local_130[uVar12 * 4] = TVar7;
          uVar17 = uVar12 + 1;
          uVar9 = uVar9 + 1;
          if ((3 < uVar9) || (uVar16 <= uVar17)) {
            uVar9 = 0;
            if (uVar19 <= uVar12) {
              pTVar21 = local_130 + (ulong)uVar19 * 4 + 1;
              do {
                TVar7 = pTVar21[0xffffffffffffffff];
                (J->fold).ins.field_0.ot = 0x2809;
                (J->fold).ins.field_0.op1 = (IRRef1)trdst;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                TVar8 = lj_opt_fold(J);
                TVar7 = *pTVar21;
                (J->fold).ins.field_0.ot = (ushort)pTVar21[0xfffffffffffffffe] | 0x4b00;
                (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
                lj_opt_fold(J);
                uVar19 = uVar19 + 1;
                pTVar21 = pTVar21 + 4;
              } while (uVar20 != uVar19);
              uVar9 = 0;
              uVar19 = uVar20;
            }
          }
          uVar20 = uVar20 + 1;
          uVar12 = uVar17;
        } while (uVar17 != uVar16);
        if (bVar10) {
          return;
        }
        goto LAB_00137200;
      }
    }
  }
LAB_001371e9:
  lj_ir_call(J,IRCALL_memcpy,(ulong)trdst,(ulong)trsrc,(ulong)trlen);
LAB_00137200:
  (J->fold).ins.field_0.ot = 0x5400;
  (J->fold).ins.field_1.op12 = 0;
  lj_opt_fold(J);
  return;
}

Assistant:

static void crec_copy(jit_State *J, TRef trdst, TRef trsrc, TRef trlen,
		      CType *ct)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_COPY_MAXUNROLL];
    MSize mlp = 0;
    CTSize step = 1, len = (CTSize)IR(tref_ref(trlen))->i;
    IRType tp = IRT_CDATA;
    int needxbar = 0;
    if (len == 0) return;  /* Shortcut. */
    if (len > CREC_COPY_MAXLEN) goto fallback;
    if (ct) {
      CTState *cts = ctype_ctsG(J2G(J));
      lua_assert(ctype_isarray(ct->info) || ctype_isstruct(ct->info));
      if (ctype_isarray(ct->info)) {
	CType *cct = ctype_rawchild(cts, ct);
	tp = crec_ct2irt(cts, cct);
	if (tp == IRT_CDATA) goto rawcopy;
	step = lj_ir_type_size[tp];
	lua_assert((len & (step-1)) == 0);
      } else if ((ct->info & CTF_UNION)) {
	step = (1u << ctype_align(ct->info));
	goto rawcopy;
      } else {
	mlp = crec_copy_struct(ml, cts, ct);
	goto emitcopy;
      }
    } else {
    rawcopy:
      needxbar = 1;
      if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
	step = CTSIZE_PTR;
    }
    mlp = crec_copy_unroll(ml, len, step, tp);
  emitcopy:
    if (mlp) {
      crec_copy_emit(J, ml, mlp, trdst, trsrc);
      if (needxbar)
	emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
      return;
    }
  }
fallback:
  /* Call memcpy. Always needs a barrier to disable alias analysis. */
  lj_ir_call(J, IRCALL_memcpy, trdst, trsrc, trlen);
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}